

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_patchval(FuncState *fs,BCPos list,BCPos vtarget,BCReg reg,BCPos dtarget)

{
  BCPos BVar1;
  int iVar2;
  BCReg in_ECX;
  undefined4 in_EDX;
  BCPos in_ESI;
  FuncState *in_RDI;
  BCPos in_R8D;
  BCPos next;
  
  while (in_ESI != 0xffffffff) {
    BVar1 = jmp_next(in_RDI,in_ESI);
    iVar2 = jmp_patchtestreg(in_RDI,in_ESI,in_ECX);
    if (iVar2 == 0) {
      jmp_patchins((FuncState *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D);
      in_ESI = BVar1;
    }
    else {
      jmp_patchins((FuncState *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D);
      in_ESI = BVar1;
    }
  }
  return;
}

Assistant:

static void jmp_patchval(FuncState *fs, BCPos list, BCPos vtarget,
			 BCReg reg, BCPos dtarget)
{
  while (list != NO_JMP) {
    BCPos next = jmp_next(fs, list);
    if (jmp_patchtestreg(fs, list, reg))
      jmp_patchins(fs, list, vtarget);  /* Jump to target with value. */
    else
      jmp_patchins(fs, list, dtarget);  /* Jump to default target. */
    list = next;
  }
}